

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_resource_manager.cpp
# Opt level: O3

bool __thiscall
CS248::GLResourceManager::setTextureSampler
          (GLResourceManager *this,ProgramId pid,string *paramName,TextureId texid,int textureUnit)

{
  GLint GVar1;
  
  GVar1 = (*__glewGetUniformLocation)(pid.id,(paramName->_M_dataplus)._M_p);
  if (-1 < GVar1) {
    (*__glewActiveTexture)(textureUnit + 0x84c0);
    glBindTexture(0xde1,texid.id);
    (*__glewUniform1i)(GVar1,textureUnit);
  }
  return -1 < GVar1;
}

Assistant:

bool GLResourceManager::setTextureSampler(ProgramId pid, const std::string& paramName, TextureId texid, int textureUnit) {
    bool success = true;
    int textureLoc = glGetUniformLocation(pid.id, paramName.c_str());
    GLenum glTextureUnitEnum = GL_TEXTURE0 + textureUnit;
    if (textureLoc >= 0) {
        // bind the texture object given by texid to the pipeline.
        glActiveTexture(glTextureUnitEnum);
        // Cannot unbind this texture as it will point the active unit to an invalid texture
        glBindTexture(GL_TEXTURE_2D, texid.id);
        // make sure the shader knows with texture unit is providing data for the corresponding
        // shader sampler variable
        glUniform1i(textureLoc, textureUnit);
    } else {
        success = false;
    }
    return success;
}